

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_header_gen.c
# Opt level: O2

void codePTL(H265eStream *s,H265ePTL *ptl,RK_U32 profilePresentFlag,int maxNumSubLayersMinus1)

{
  ulong uVar1;
  ulong uVar2;
  RK_S32 *pRVar3;
  ProfileTierLevel *ptl_00;
  bool bVar4;
  
  if (profilePresentFlag != 0) {
    codeProfileTier(s,&ptl->m_generalPTL);
  }
  h265e_stream_write_with_log(s,(ptl->m_generalPTL).m_levelIdc,8,"general_level_idc");
  pRVar3 = ptl->m_subLayerProfilePresentFlag;
  uVar1 = 0;
  uVar2 = 0;
  if (0 < maxNumSubLayersMinus1) {
    uVar2 = (ulong)(uint)maxNumSubLayersMinus1;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    if (profilePresentFlag != 0) {
      h265e_stream_write1_with_log
                (s,ptl->m_subLayerProfilePresentFlag[uVar1],"sub_layer_profile_present_flag[i]");
    }
    h265e_stream_write1_with_log
              (s,ptl->m_subLayerLevelPresentFlag[uVar1],"sub_layer_level_present_flag[i]");
  }
  if (0 < maxNumSubLayersMinus1) {
    for (; maxNumSubLayersMinus1 < 8; maxNumSubLayersMinus1 = maxNumSubLayersMinus1 + 1) {
      h265e_stream_write_with_log(s,0,2,"reserved_zero_2bits");
    }
  }
  ptl_00 = ptl->m_subLayerPTL;
  while (bVar4 = uVar2 != 0, uVar2 = uVar2 - 1, bVar4) {
    if ((profilePresentFlag != 0) && (*pRVar3 != 0)) {
      codeProfileTier(s,ptl_00);
    }
    if (pRVar3[6] != 0) {
      h265e_stream_write_with_log(s,ptl_00->m_levelIdc,8,"sub_layer_level_idc[i]");
    }
    pRVar3 = pRVar3 + 1;
    ptl_00 = ptl_00 + 1;
  }
  return;
}

Assistant:

void codePTL(H265eStream *s, H265ePTL* ptl, RK_U32 profilePresentFlag, int maxNumSubLayersMinus1)
{
    RK_S32 i;
    if (profilePresentFlag) {
        codeProfileTier(s, &ptl->m_generalPTL);
    }
    h265e_stream_write_with_log(s, ptl->m_generalPTL.m_levelIdc, 8, "general_level_idc");

    for (i = 0; i < maxNumSubLayersMinus1; i++) {
        if (profilePresentFlag) {
            h265e_stream_write1_with_log(s, ptl->m_subLayerProfilePresentFlag[i], "sub_layer_profile_present_flag[i]");
        }

        h265e_stream_write1_with_log(s, ptl->m_subLayerLevelPresentFlag[i], "sub_layer_level_present_flag[i]");
    }

    if (maxNumSubLayersMinus1 > 0) {
        for (i = maxNumSubLayersMinus1; i < 8; i++) {
            h265e_stream_write_with_log(s, 0, 2, "reserved_zero_2bits");
        }
    }

    for (i = 0; i < maxNumSubLayersMinus1; i++) {
        if (profilePresentFlag && ptl->m_subLayerProfilePresentFlag[i]) {
            codeProfileTier(s, &ptl->m_subLayerPTL[i]); // sub_layer_...
        }
        if (ptl->m_subLayerLevelPresentFlag[i]) {
            h265e_stream_write_with_log(s, ptl->m_subLayerPTL[i].m_levelIdc, 8, "sub_layer_level_idc[i]");
        }
    }
}